

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ziparchive.cpp
# Opt level: O2

void __thiscall ZipArchive::add(ZipArchive *this,ZipEntry *entry)

{
  File *this_00;
  uint8_t *puVar1;
  uchar *target;
  undefined8 uVar2;
  undefined4 uVar3;
  tm *ptVar4;
  size_t sVar5;
  char cVar6;
  uint uVar7;
  void *__buf;
  void *__buf_00;
  uint16_t uVar8;
  int iVar9;
  uint uVar10;
  uint8_t *puVar11;
  bool bVar12;
  ulong __n;
  
  ptVar4 = localtime(&entry->timeStamp);
  uVar10 = ptVar4->tm_sec >> 1 |
           ptVar4->tm_min << 5 | ptVar4->tm_hour << 0xb | ptVar4->tm_mday << 0x10 |
           ptVar4->tm_mon * 0x200000 + 0x200000U | ptVar4->tm_year * 0x2000000 + 0x60000000U;
  this_00 = &this->f;
  sVar5 = File::tell(this_00);
  this->lastHeader = sVar5;
  __n = (entry->name)._M_string_length;
  puVar1 = this->entryPtr;
  cVar6 = this->force64;
  if ((bool)cVar6 == false) {
    cVar6 = 0xfffffffe < sVar5 || (0xfffffffe < entry->originalSize || 0xfffffffe < entry->dataSize)
    ;
  }
  puVar1[4] = '\0';
  puVar1[5] = '\0';
  puVar1[6] = '\0';
  puVar1[7] = '\0';
  puVar1[8] = '\0';
  puVar1[9] = '\0';
  puVar1[10] = '\0';
  puVar1[0xb] = '\0';
  puVar1[0xc] = '\0';
  puVar1[0xd] = '\0';
  puVar1[0xe] = '\0';
  puVar1[0xf] = '\0';
  puVar1[0x10] = '\0';
  puVar1[0x11] = '\0';
  puVar1[0x12] = '\0';
  puVar1[0x13] = '\0';
  puVar1[0x1e] = '\0';
  puVar1[0x1f] = '\0';
  puVar1[0x20] = '\0';
  puVar1[0x21] = '\0';
  puVar1[0x22] = '\0';
  puVar1[0x23] = '\0';
  puVar1[0x24] = '\0';
  puVar1[0x25] = '\0';
  puVar1[0x26] = '\0';
  puVar1[0x27] = '\0';
  puVar1[0x28] = '\0';
  puVar1[0x29] = '\0';
  puVar1[0x2a] = '\0';
  puVar1[0x2b] = '\0';
  puVar1[0x2c] = '\0';
  puVar1[0x2d] = '\0';
  puVar1[0x14] = '\0';
  puVar1[0x15] = '\0';
  puVar1[0x16] = '\0';
  puVar1[0x17] = '\0';
  puVar1[0x18] = '\0';
  puVar1[0x19] = '\0';
  puVar1[0x1a] = '\0';
  puVar1[0x1b] = '\0';
  puVar1[0x1c] = '\0';
  puVar1[0x1d] = '\0';
  puVar1[0x1e] = '\0';
  puVar1[0x1f] = '\0';
  puVar1[0x20] = '\0';
  puVar1[0x21] = '\0';
  puVar1[0x22] = '\0';
  puVar1[0x23] = '\0';
  puVar1[0] = 'P';
  puVar1[1] = 'K';
  puVar1[2] = '\x01';
  puVar1[3] = '\x02';
  puVar1[6] = '\x14';
  puVar1[7] = '\0';
  *(ushort *)(puVar1 + 10) = (entry->store ^ 1) << 3;
  *(uint32_t *)(puVar1 + 0x10) = entry->crc;
  bVar12 = cVar6 != '\0';
  uVar3 = (int)entry->dataSize;
  if (bVar12) {
    uVar3 = 0xffffffff;
  }
  *(undefined4 *)(puVar1 + 0x14) = uVar3;
  uVar3 = (undefined4)entry->originalSize;
  if (bVar12) {
    uVar3 = 0xffffffff;
  }
  *(undefined4 *)(puVar1 + 0x18) = uVar3;
  uVar8 = (uint16_t)__n;
  *(uint16_t *)(puVar1 + 0x1c) = uVar8;
  uVar3 = (undefined4)this->lastHeader;
  if (bVar12) {
    uVar3 = 0xffffffff;
  }
  *(undefined4 *)(puVar1 + 0x2a) = uVar3;
  *(uint *)(puVar1 + 0xc) = uVar10;
  *(int *)(puVar1 + 0x26) = *(int *)&entry->flags << 0x10;
  puVar11 = this->entryPtr;
  this->entryPtr = puVar11 + 0x2e;
  iVar9 = (int)__n;
  memcpy(puVar11 + 0x2e,(entry->name)._M_dataplus._M_p,(long)iVar9);
  puVar11 = this->entryPtr + iVar9;
  this->entryPtr = puVar11;
  if (cVar6 != '\0') {
    puVar1[6] = '-';
    puVar1[7] = '\0';
    *(short *)(puVar1 + 0x1e) = *(short *)(puVar1 + 0x1e) + 0x20;
    add::extra64.compSize._0_4_ = (undefined4)entry->dataSize;
    add::extra64.compSize._4_4_ = (undefined4)(entry->dataSize >> 0x20);
    add::extra64.uncompSize._0_4_ = (undefined4)entry->originalSize;
    add::extra64.uncompSize._4_4_ = (undefined4)(entry->originalSize >> 0x20);
    add::extra64.offset._0_4_ = (undefined4)this->lastHeader;
    add::extra64.offset._4_4_ = (undefined4)(this->lastHeader >> 0x20);
    uVar2 = CONCAT44((undefined4)add::extra64.compSize,add::extra64.uncompSize._4_4_);
    *(ulong *)puVar11 = CONCAT44((undefined4)add::extra64.uncompSize,add::extra64._0_4_);
    *(undefined8 *)(puVar11 + 8) = uVar2;
    uVar2 = CONCAT44(add::extra64.disk,add::extra64.offset._4_4_);
    *(ulong *)(puVar11 + 0x10) =
         CONCAT44((undefined4)add::extra64.offset,add::extra64.compSize._4_4_);
    *(undefined8 *)(puVar11 + 0x18) = uVar2;
    this->entryPtr = this->entryPtr + 0x20;
  }
  this->entryCount = this->entryCount + 1;
  add::head.method = (entry->store ^ 1) << 3;
  add::head.crc = entry->crc;
  add::head.v1 = 0x14;
  add::head.compSize = (uint32_t)entry->dataSize;
  if (cVar6 != '\0') {
    add::head.compSize = 0xffffffff;
  }
  add::head.uncompSize = 0xffffffff;
  if (cVar6 == '\0') {
    add::head.uncompSize = (uint32_t)entry->originalSize;
  }
  add::head.exLen = 0;
  if ((entry->store == true) && (this->zipAlign == true)) {
    uVar7 = (iVar9 + (int)this->lastHeader & 3U ^ 0xfffffffd) + 5;
    __n = (ulong)uVar7;
    add::head.exLen = (uint16_t)uVar7;
  }
  add::head.dateTime = uVar10;
  add::head.nameLen = uVar8;
  if (cVar6 == '\0') {
    File::Write<LocalEntry>(this_00,&add::head);
    write(this,(int)entry,__buf_00,__n);
    if ((ulong)add::head.exLen != 0) {
      File::Write<unsigned_char>(this_00,"",(ulong)add::head.exLen);
    }
  }
  else {
    add::head.exLen = 0x20;
    add::head.v1 = 0x2d;
    File::Write<LocalEntry>(this_00,&add::head);
    write(this,(int)entry,__buf,__n);
    File::Write<Extra64>(this_00,&add::extra64);
  }
  target = (entry->data)._M_t.
           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  if (target != (uchar *)0x0) {
    File::Write<unsigned_char>(this_00,target,entry->dataSize);
    return;
  }
  return;
}

Assistant:

void ZipArchive::add(const ZipEntry& entry)
{
    static LocalEntry head = {0x04034b50, 10, 0, 0, 0, 0, 0, 0, 0, 0};
    static Extra64 extra64 = {0x1, 28, 0, 0, 0, 0};
    static const uint8_t zeroes[] = {0, 0, 0, 0};
    const struct tm* lt = localtime(&entry.timeStamp);
    // date:   YYYYYYYM MMMDDDDD
    // time:   HHHHHMMM MMMSSSSS
    uint32_t msdos_ts = ((lt->tm_year - 80) << 25) | ((lt->tm_mon + 1) << 21) |
                        (lt->tm_mday << 16) | (lt->tm_hour << 11) |
                        (lt->tm_min << 5) | (lt->tm_sec >> 1);

    lastHeader = f.tell(); // ftell_x(fp);

    int fl = entry.name.length();
    auto* e = reinterpret_cast<CentralDirEntry*>(entryPtr);

    bool ext64 = force64;
    if (!ext64)
        ext64 = (entry.dataSize > 0xfffffffe ||
                 entry.originalSize > 0xfffffffe || lastHeader > 0xfffffffeL);

    memset(e, 0, sizeof(CentralDirEntry));
    e->sig = 0x02014b50;
    e->v1 = 20;
    e->method = entry.store ? 0 : 8;
    e->crc = entry.crc;
    e->compSize = ext64 ? 0xffffffff : entry.dataSize;
    e->uncompSize = ext64 ? 0xffffffff : entry.originalSize;
    e->nameLen = fl;
    e->offset = ext64 ? 0xffffffff : lastHeader;
    e->dateTime = msdos_ts;
    e->attr1 = entry.flags << 16;

    entryPtr += sizeof(CentralDirEntry);
    memcpy(entryPtr, entry.name.c_str(), fl);
    entryPtr += fl;

    // ext64 = true;

    if (ext64) {
        e->v1 = 45;
        e->exLen += sizeof(Extra64);
        extra64.compSize = entry.dataSize;
        extra64.uncompSize = entry.originalSize;
        extra64.offset = lastHeader;
        memcpy(entryPtr, &extra64, sizeof(Extra64));
        entryPtr += sizeof(Extra64);
    }

    entryCount++;

    // printf("Added %d files in %ld bytes\n", entryCount, entryPtr - entries);

    // lastHeader 30 bytes
    head.method = entry.store ? 0 : 8;
    head.crc = entry.crc;
    head.v1 = 20;
    head.compSize = ext64 ? 0xffffffff : entry.dataSize;
    head.uncompSize = ext64 ? 0xffffffff : entry.originalSize;
    head.dateTime = msdos_ts;
    head.nameLen = fl;
    head.exLen = 0;

    if (entry.store && zipAlign)
        head.exLen = 4 - (lastHeader + fl + sizeof(LocalEntry)) % 4;

    if (ext64) {
        head.exLen = sizeof(Extra64);
        head.v1 = 45;
    }

    write(head);
    write(entry.name);

    if (ext64) {
        write(extra64);
    } else if (head.exLen > 0) {
        write(zeroes, head.exLen);
    }
    if (entry.data)
        write(entry.data.get(), entry.dataSize);
}